

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O0

void __thiscall wasm::WasmBinaryWriter::writeNames(WasmBinaryWriter *this)

{
  Name *pNVar1;
  BufferWithRandomAccess *pBVar2;
  type pFVar3;
  type pMVar4;
  unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
  *this_00;
  bool bVar5;
  int32_t start_00;
  ulong uVar6;
  size_type sVar7;
  size_type sVar8;
  reference __in;
  type *ptVar9;
  size_t sVar10;
  pointer ppVar11;
  mapped_type *pmVar12;
  reference pHVar13;
  vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
  *this_01;
  pointer pEVar14;
  vector<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
  *this_02;
  pointer pDVar15;
  size_type sVar16;
  reference pvVar17;
  mapped_type *pmVar18;
  mapped_type *pmVar19;
  size_type sVar20;
  vector<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
  *this_03;
  pointer pTVar21;
  vector<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
  *pvVar22;
  vector<std::pair<unsigned_int,_wasm::Table_*>,_std::allocator<std::pair<unsigned_int,_wasm::Table_*>_>_>
  *pvVar23;
  vector<std::pair<unsigned_int,_wasm::Memory_*>,_std::allocator<std::pair<unsigned_int,_wasm::Memory_*>_>_>
  *pvVar24;
  vector<std::pair<unsigned_int,_wasm::Global_*>,_std::allocator<std::pair<unsigned_int,_wasm::Global_*>_>_>
  *pvVar25;
  string_view sVar26;
  anon_class_16_2_9999778b visitor;
  anon_class_16_2_9999778b visitor_00;
  anon_class_16_2_f4096cd2 visitor_01;
  anon_class_16_2_f4096cd2 visitor_02;
  anon_class_16_2_aa9076f3 visitor_03;
  anon_class_16_2_aa9076f3 visitor_04;
  anon_class_16_2_5b4c7dad visitor_05;
  anon_class_16_2_5b4c7dad visitor_06;
  anon_class_16_2_53660720 visitor_07;
  anon_class_16_2_53660720 visitor_08;
  U32LEB local_6bc;
  reference local_6b8;
  value_type *tag_1;
  U32LEB local_6a8;
  Index i_2;
  reference puStack_6a0;
  int32_t substart_10;
  unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_> *tag;
  iterator __end2_4;
  iterator __begin2_4;
  vector<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
  *__range2_4;
  Index count_1;
  U32LEB local_65c;
  string_view *local_658;
  type *name_1;
  type *index_6;
  _Node_iterator_base<std::pair<const_unsigned_int,_wasm::Name>,_false> local_640;
  iterator __end4_1;
  iterator __begin4_1;
  unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
  *__range4_1;
  unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
  *local_620;
  unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
  *fieldNames;
  key_type local_610;
  value_type type_3;
  U32LEB local_600;
  Index i_1;
  reference pHStack_5f8;
  int32_t substart_9;
  HeapType *type_2;
  iterator __end2_3;
  iterator __begin2_3;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *__range2_3;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> relevantTypes;
  U32LEB local_5ac;
  reference local_5a8;
  value_type *seg_1;
  U32LEB local_598;
  Index i;
  reference puStack_590;
  int32_t substart_8;
  unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_> *seg;
  iterator __end2_2;
  iterator __begin2_2;
  vector<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
  *__range2_2;
  Index count;
  U32LEB local_54c;
  type *local_548;
  type *elem;
  type *index_5;
  __normal_iterator<std::pair<unsigned_int,_wasm::ElementSegment_*>_*,_std::vector<std::pair<unsigned_int,_wasm::ElementSegment_*>,_std::allocator<std::pair<unsigned_int,_wasm::ElementSegment_*>_>_>_>
  local_530;
  iterator __end3_6;
  iterator __begin3_6;
  vector<std::pair<unsigned_int,_wasm::ElementSegment_*>,_std::allocator<std::pair<unsigned_int,_wasm::ElementSegment_*>_>_>
  *__range3_6;
  pointer pEStack_510;
  int32_t substart_7;
  pair<unsigned_int,_wasm::ElementSegment_*> local_508;
  unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *local_4f8;
  unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *curr;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
  *__range2_1;
  undefined1 local_4d0 [4];
  Index checked_5;
  vector<std::pair<unsigned_int,_wasm::ElementSegment_*>,_std::allocator<std::pair<unsigned_int,_wasm::ElementSegment_*>_>_>
  elemsWithNames;
  U32LEB local_4a4;
  type *local_4a0;
  type *global_1;
  type *index_4;
  __normal_iterator<std::pair<unsigned_int,_wasm::Global_*>_*,_std::vector<std::pair<unsigned_int,_wasm::Global_*>,_std::allocator<std::pair<unsigned_int,_wasm::Global_*>_>_>_>
  local_488;
  iterator __end3_5;
  iterator __begin3_5;
  vector<std::pair<unsigned_int,_wasm::Global_*>,_std::allocator<std::pair<unsigned_int,_wasm::Global_*>_>_>
  *__range3_5;
  Module *pMStack_468;
  int32_t substart_6;
  vector<std::pair<unsigned_int,_wasm::Global_*>,_std::allocator<std::pair<unsigned_int,_wasm::Global_*>_>_>
  *pvStack_460;
  Module *local_458;
  vector<std::pair<unsigned_int,_wasm::Global_*>,_std::allocator<std::pair<unsigned_int,_wasm::Global_*>_>_>
  *pvStack_450;
  Module *pMStack_448;
  anon_class_16_2_53660720 check_4;
  undefined1 local_430 [4];
  Index checked_4;
  vector<std::pair<unsigned_int,_wasm::Global_*>,_std::allocator<std::pair<unsigned_int,_wasm::Global_*>_>_>
  globalsWithNames;
  U32LEB local_404;
  pointer local_400;
  type *memory;
  type *index_3;
  __normal_iterator<std::pair<unsigned_int,_wasm::Memory_*>_*,_std::vector<std::pair<unsigned_int,_wasm::Memory_*>,_std::allocator<std::pair<unsigned_int,_wasm::Memory_*>_>_>_>
  local_3e8;
  iterator __end3_4;
  iterator __begin3_4;
  vector<std::pair<unsigned_int,_wasm::Memory_*>,_std::allocator<std::pair<unsigned_int,_wasm::Memory_*>_>_>
  *__range3_4;
  Module *pMStack_3c8;
  int32_t substart_5;
  vector<std::pair<unsigned_int,_wasm::Memory_*>,_std::allocator<std::pair<unsigned_int,_wasm::Memory_*>_>_>
  *pvStack_3c0;
  Module *local_3b8;
  vector<std::pair<unsigned_int,_wasm::Memory_*>,_std::allocator<std::pair<unsigned_int,_wasm::Memory_*>_>_>
  *pvStack_3b0;
  Module *pMStack_3a8;
  anon_class_16_2_5b4c7dad check_3;
  undefined1 local_390 [4];
  Index checked_3;
  vector<std::pair<unsigned_int,_wasm::Memory_*>,_std::allocator<std::pair<unsigned_int,_wasm::Memory_*>_>_>
  memoriesWithNames;
  U32LEB local_364;
  pointer local_360;
  type *table;
  type *index_2;
  __normal_iterator<std::pair<unsigned_int,_wasm::Table_*>_*,_std::vector<std::pair<unsigned_int,_wasm::Table_*>,_std::allocator<std::pair<unsigned_int,_wasm::Table_*>_>_>_>
  local_348;
  iterator __end3_3;
  iterator __begin3_3;
  vector<std::pair<unsigned_int,_wasm::Table_*>,_std::allocator<std::pair<unsigned_int,_wasm::Table_*>_>_>
  *__range3_3;
  Module *pMStack_328;
  int32_t substart_4;
  pointer pbStack_320;
  Module *local_318;
  vector<std::pair<unsigned_int,_wasm::Table_*>,_std::allocator<std::pair<unsigned_int,_wasm::Table_*>_>_>
  *pvStack_310;
  Module *pMStack_308;
  anon_class_16_2_aa9076f3 check_2;
  undefined1 local_2f0 [4];
  Index checked_2;
  vector<std::pair<unsigned_int,_wasm::Table_*>,_std::allocator<std::pair<unsigned_int,_wasm::Table_*>_>_>
  tablesWithNames;
  U32LEB local_2bc;
  key_type local_2b8;
  HeapType type_1;
  iterator __end3_2;
  iterator __begin3_2;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *__range3_2;
  __node_base _Stack_290;
  int32_t substart_3;
  HeapType type;
  iterator __end2;
  iterator __begin2;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *__range2;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> namedTypes;
  U32LEB local_244;
  undefined1 local_240 [8];
  type *name;
  type *indexInBinary_1;
  __normal_iterator<std::pair<unsigned_int,_wasm::Name>_*,_std::vector<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>_>
  local_228;
  iterator __end4;
  iterator __begin4;
  vector<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
  *__range4;
  atomic<MixedArena_*> local_208;
  __normal_iterator<std::pair<unsigned_int,_wasm::Name>_*,_std::vector<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>_>
  local_200;
  string_view local_1f8;
  pair<unsigned_int,_wasm::Name> local_1e8;
  int local_1cc;
  pair<unsigned_int,_unsigned_int> local_1c8;
  undefined1 local_1c0 [16];
  iterator iter;
  Index indexInBinary;
  Index indexInFunc;
  size_t numLocals;
  vector<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
  localsWithNames;
  type *func;
  type *index_1;
  __normal_iterator<std::pair<unsigned_int,_wasm::Function_*>_*,_std::vector<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>_>
  local_170;
  iterator __end3_1;
  iterator __begin3_1;
  vector<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
  *__range3_1;
  U32LEB local_150;
  Index emitted;
  __node_base _Stack_148;
  int32_t substart_2;
  vector<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
  *pvStack_140;
  Module *local_138;
  vector<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
  *pvStack_130;
  Module *pMStack_128;
  anon_class_16_2_f4096cd2 check_1;
  undefined1 local_110 [4];
  Index checked_1;
  vector<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
  functionsWithLocalNames;
  U32LEB local_e4;
  __node_base local_e0;
  type *global;
  type *index;
  atomic<MixedArena_*> local_c8;
  iterator __end3;
  iterator __begin3;
  vector<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
  *__range3;
  __node_base _Stack_a8;
  int32_t substart_1;
  __node_base _Stack_a0;
  Module *local_88;
  vector<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
  *pvStack_80;
  __node_base _Stack_70;
  anon_class_16_2_9999778b check;
  undefined1 local_58 [4];
  Index checked;
  vector<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
  functionsWithNames;
  undefined1 auStack_28 [4];
  int32_t substart;
  int32_t local_14;
  WasmBinaryWriter *pWStack_10;
  int32_t start;
  WasmBinaryWriter *this_local;
  
  pWStack_10 = this;
  local_14 = startSection<wasm::BinaryConsts::Section>(this,Custom);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)auStack_28,
             BinaryConsts::CustomSections::Name);
  writeInlineString(this,_auStack_28);
  if (((this->emitModuleName & 1U) != 0) &&
     (bVar5 = IString::is(&(this->wasm->name).super_IString), bVar5)) {
    start_00 = startSubsection(this,NameModule);
    pNVar1 = &this->wasm->name;
    functionsWithNames.
    super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(pNVar1->super_IString).str._M_len
    ;
    writeEscapedName(this,(pNVar1->super_IString).str);
    finishSubsection(this,start_00);
  }
  if ((this->debugInfo & 1U) == 0) {
    finishSection(this,local_14);
  }
  else {
    std::
    vector<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
    ::vector((vector<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
              *)local_58);
    check.checked._4_4_ = 0;
    pvVar22 = (vector<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
               *)((long)&check.checked + 4);
    visitor.checked = (Index *)pvVar22;
    visitor.functionsWithNames = pvVar22;
    local_88 = (Module *)local_58;
    pvStack_80 = pvVar22;
    _Stack_70._M_nxt = (_Hash_node_base *)local_58;
    check.functionsWithNames = pvVar22;
    wasm::ModuleUtils::iterImportedFunctions<wasm::WasmBinaryWriter::writeNames()::__0>
              ((ModuleUtils *)this->wasm,(Module *)local_58,visitor);
    _Stack_a8._M_nxt = _Stack_70._M_nxt;
    _Stack_a0._M_nxt = (_Hash_node_base *)check.functionsWithNames;
    visitor_00.checked = (Index *)pvVar22;
    visitor_00.functionsWithNames = check.functionsWithNames;
    wasm::ModuleUtils::iterDefinedFunctions<wasm::WasmBinaryWriter::writeNames()::__0>
              ((ModuleUtils *)this->wasm,(Module *)_Stack_70._M_nxt,visitor_00);
    uVar6 = (ulong)check.checked._4_4_;
    sVar7 = std::
            unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
            ::size(&(this->indexes).functionIndexes);
    if (uVar6 != sVar7) {
      __assert_fail("checked == indexes.functionIndexes.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-binary.cpp"
                    ,0x385,"void wasm::WasmBinaryWriter::writeNames()");
    }
    sVar8 = std::
            vector<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
            ::size((vector<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                    *)local_58);
    if (sVar8 != 0) {
      __range3._4_4_ = startSubsection(this,DylinkMemInfo);
      pBVar2 = this->o;
      sVar8 = std::
              vector<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
              ::size((vector<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                      *)local_58);
      LEB<unsigned_int,_unsigned_char>::LEB
                ((LEB<unsigned_int,_unsigned_char> *)&__range3,(uint)sVar8);
      BufferWithRandomAccess::operator<<(pBVar2,__range3._0_4_);
      __end3 = std::
               vector<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
               ::begin((vector<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                        *)local_58);
      local_c8._M_b._M_p =
           (__base_type)
           std::
           vector<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
           ::end((vector<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                  *)local_58);
      while (bVar5 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<std::pair<unsigned_int,_wasm::Function_*>_*,_std::vector<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>_>
                                         *)&local_c8), bVar5) {
        index = &__gnu_cxx::
                 __normal_iterator<std::pair<unsigned_int,_wasm::Function_*>_*,_std::vector<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>_>
                 ::operator*(&__end3)->first;
        global = (type *)std::get<0ul,unsigned_int,wasm::Function*>
                                   ((pair<unsigned_int,_wasm::Function_*> *)index);
        local_e0._M_nxt =
             (_Hash_node_base *)
             std::get<1ul,unsigned_int,wasm::Function*>
                       ((pair<unsigned_int,_wasm::Function_*> *)index);
        pBVar2 = this->o;
        LEB<unsigned_int,_unsigned_char>::LEB(&local_e4,*(uint *)global);
        BufferWithRandomAccess::operator<<(pBVar2,local_e4);
        pFVar3 = (type)(((__uniq_ptr_data<wasm::Global,_std::default_delete<wasm::Global>,_true,_true>
                          *)&(local_e0._M_nxt)->_M_nxt)->
                       super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>)._M_t
                       .super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                       super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
        functionsWithLocalNames.
        super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             *(pointer *)&(pFVar3->super_Importable).super_Named;
        writeEscapedName(this,*(string_view *)&(pFVar3->super_Importable).super_Named);
        __gnu_cxx::
        __normal_iterator<std::pair<unsigned_int,_wasm::Function_*>_*,_std::vector<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>_>
        ::operator++(&__end3);
      }
      finishSubsection(this,__range3._4_4_);
    }
    std::
    vector<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
    ::~vector((vector<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
               *)local_58);
    std::
    vector<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
    ::vector((vector<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
              *)local_110);
    check_1.checked._4_4_ = 0;
    pvVar22 = (vector<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
               *)((long)&check_1.checked + 4);
    visitor_01.checked = (Index *)pvVar22;
    visitor_01.functionsWithLocalNames = pvVar22;
    local_138 = (Module *)local_110;
    pvStack_130 = pvVar22;
    pMStack_128 = (Module *)local_110;
    check_1.functionsWithLocalNames = pvVar22;
    wasm::ModuleUtils::iterImportedFunctions<wasm::WasmBinaryWriter::writeNames()::__1>
              ((ModuleUtils *)this->wasm,(Module *)local_110,visitor_01);
    _Stack_148._M_nxt = (_Hash_node_base *)pMStack_128;
    pvStack_140 = check_1.functionsWithLocalNames;
    visitor_02.checked = (Index *)pvVar22;
    visitor_02.functionsWithLocalNames = check_1.functionsWithLocalNames;
    wasm::ModuleUtils::iterDefinedFunctions<wasm::WasmBinaryWriter::writeNames()::__1>
              ((ModuleUtils *)this->wasm,pMStack_128,visitor_02);
    uVar6 = (ulong)check_1.checked._4_4_;
    sVar7 = std::
            unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
            ::size(&(this->indexes).functionIndexes);
    if (uVar6 != sVar7) {
      __assert_fail("checked == indexes.functionIndexes.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-binary.cpp"
                    ,0x3a4,"void wasm::WasmBinaryWriter::writeNames()");
    }
    sVar8 = std::
            vector<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
            ::size((vector<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                    *)local_110);
    if (sVar8 != 0) {
      emitted = startSubsection(this,DylinkNeeded);
      pBVar2 = this->o;
      sVar8 = std::
              vector<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
              ::size((vector<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                      *)local_110);
      LEB<unsigned_int,_unsigned_char>::LEB(&local_150,(uint)sVar8);
      BufferWithRandomAccess::operator<<(pBVar2,local_150);
      __range3_1._4_4_ = 0;
      __end3_1 = std::
                 vector<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                 ::begin((vector<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                          *)local_110);
      local_170._M_current =
           (pair<unsigned_int,_wasm::Function_*> *)
           std::
           vector<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
           ::end((vector<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                  *)local_110);
      while( true ) {
        bVar5 = __gnu_cxx::operator!=(&__end3_1,&local_170);
        if (!bVar5) break;
        __in = __gnu_cxx::
               __normal_iterator<std::pair<unsigned_int,_wasm::Function_*>_*,_std::vector<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>_>
               ::operator*(&__end3_1);
        ptVar9 = std::get<0ul,unsigned_int,wasm::Function*>(__in);
        localsWithNames.
        super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)std::get<1ul,unsigned_int,wasm::Function*>(__in);
        std::
        vector<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
        ::vector((vector<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
                  *)&numLocals);
        sVar10 = Function::getNumLocals
                           (*(Function **)
                             localsWithNames.
                             super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
        for (iter.
             super__Node_iterator_base<std::pair<const_wasm::Name,_std::unordered_map<std::pair<unsigned_int,_unsigned_int>,_unsigned_long,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>_>_>,_true>
             ._M_cur._4_4_ = 0;
            iter.
            super__Node_iterator_base<std::pair<const_wasm::Name,_std::unordered_map<std::pair<unsigned_int,_unsigned_int>,_unsigned_long,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>_>_>,_true>
            ._M_cur._4_4_ < sVar10;
            iter.
            super__Node_iterator_base<std::pair<const_wasm::Name,_std::unordered_map<std::pair<unsigned_int,_unsigned_int>,_unsigned_long,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>_>_>,_true>
            ._M_cur._4_4_ =
                 iter.
                 super__Node_iterator_base<std::pair<const_wasm::Name,_std::unordered_map<std::pair<unsigned_int,_unsigned_int>,_unsigned_long,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>_>_>,_true>
                 ._M_cur._4_4_ + 1) {
          bVar5 = Function::hasLocalName
                            (*(Function **)
                              localsWithNames.
                              super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                             iter.
                             super__Node_iterator_base<std::pair<const_wasm::Name,_std::unordered_map<std::pair<unsigned_int,_unsigned_int>,_unsigned_long,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>_>_>,_true>
                             ._M_cur._4_4_);
          if (bVar5) {
            local_1c0._8_8_ =
                 std::
                 unordered_map<wasm::Name,_std::unordered_map<std::pair<unsigned_int,_unsigned_int>,_unsigned_long,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<std::pair<unsigned_int,_unsigned_int>,_unsigned_long,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>_>_>_>_>
                 ::find(&this->funcMappedLocals,
                        *(key_type **)
                         localsWithNames.
                         super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
            local_1c0._0_8_ =
                 std::
                 unordered_map<wasm::Name,_std::unordered_map<std::pair<unsigned_int,_unsigned_int>,_unsigned_long,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<std::pair<unsigned_int,_unsigned_int>,_unsigned_long,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>_>_>_>_>
                 ::end(&this->funcMappedLocals);
            bVar5 = std::__detail::operator!=
                              ((_Node_iterator_base<std::pair<const_wasm::Name,_std::unordered_map<std::pair<unsigned_int,_unsigned_int>,_unsigned_long,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>_>_>,_true>
                                *)(local_1c0 + 8),
                               (_Node_iterator_base<std::pair<const_wasm::Name,_std::unordered_map<std::pair<unsigned_int,_unsigned_int>,_unsigned_long,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>_>_>,_true>
                                *)local_1c0);
            if (bVar5) {
              ppVar11 = std::__detail::
                        _Node_iterator<std::pair<const_wasm::Name,_std::unordered_map<std::pair<unsigned_int,_unsigned_int>,_unsigned_long,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>_>_>,_false,_true>
                        ::operator->((_Node_iterator<std::pair<const_wasm::Name,_std::unordered_map<std::pair<unsigned_int,_unsigned_int>,_unsigned_long,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>_>_>,_false,_true>
                                      *)(local_1c0 + 8));
              local_1cc = 0;
              std::pair<unsigned_int,_unsigned_int>::pair<unsigned_int_&,_int,_true>
                        (&local_1c8,
                         (uint *)((long)&iter.
                                         super__Node_iterator_base<std::pair<const_wasm::Name,_std::unordered_map<std::pair<unsigned_int,_unsigned_int>,_unsigned_long,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>_>_>,_true>
                                         ._M_cur + 4),&local_1cc);
              pmVar12 = std::
                        unordered_map<std::pair<unsigned_int,_unsigned_int>,_unsigned_long,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>_>
                        ::operator[](&ppVar11->second,&local_1c8);
              iter.
              super__Node_iterator_base<std::pair<const_wasm::Name,_std::unordered_map<std::pair<unsigned_int,_unsigned_int>,_unsigned_long,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>_>_>,_true>
              ._M_cur._0_4_ = (uint)*pmVar12;
            }
            else {
              bVar5 = Importable::imported
                                (*(Importable **)
                                  localsWithNames.
                                  super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
              if (!bVar5) {
                __assert_fail("func->imported()",
                              "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-binary.cpp"
                              ,0x3bb,"void wasm::WasmBinaryWriter::writeNames()");
              }
              iter.
              super__Node_iterator_base<std::pair<const_wasm::Name,_std::unordered_map<std::pair<unsigned_int,_unsigned_int>,_unsigned_long,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>_>_>,_true>
              ._M_cur._0_4_ =
                   iter.
                   super__Node_iterator_base<std::pair<const_wasm::Name,_std::unordered_map<std::pair<unsigned_int,_unsigned_int>,_unsigned_long,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>_>_>,_true>
                   ._M_cur._4_4_;
            }
            sVar26 = (string_view)
                     Function::getLocalName
                               (*(Function **)
                                 localsWithNames.
                                 super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                iter.
                                super__Node_iterator_base<std::pair<const_wasm::Name,_std::unordered_map<std::pair<unsigned_int,_unsigned_int>,_unsigned_long,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>_>_>,_true>
                                ._M_cur._4_4_);
            local_1f8 = sVar26;
            std::pair<unsigned_int,_wasm::Name>::pair<unsigned_int_&,_wasm::Name,_true>
                      (&local_1e8,(uint *)&iter,(Name *)&local_1f8);
            std::
            vector<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
            ::push_back((vector<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
                         *)&numLocals,&local_1e8);
          }
        }
        sVar8 = std::
                vector<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
                ::size((vector<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
                        *)&numLocals);
        if (sVar8 == 0) {
          __assert_fail("localsWithNames.size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-binary.cpp"
                        ,0x3c2,"void wasm::WasmBinaryWriter::writeNames()");
        }
        local_200._M_current =
             (pair<unsigned_int,_wasm::Name> *)
             std::
             vector<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
             ::begin((vector<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
                      *)&numLocals);
        local_208._M_b._M_p =
             (__base_type)
             std::
             vector<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
             ::end((vector<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
                    *)&numLocals);
        std::
        sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_int,wasm::Name>*,std::vector<std::pair<unsigned_int,wasm::Name>,std::allocator<std::pair<unsigned_int,wasm::Name>>>>>
                  (local_200,
                   (__normal_iterator<std::pair<unsigned_int,_wasm::Name>_*,_std::vector<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>_>
                    )local_208._M_b._M_p);
        pBVar2 = this->o;
        LEB<unsigned_int,_unsigned_char>::LEB
                  ((LEB<unsigned_int,_unsigned_char> *)((long)&__range4 + 4),*ptVar9);
        BufferWithRandomAccess::operator<<(pBVar2,__range4._4_4_);
        pBVar2 = this->o;
        sVar8 = std::
                vector<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
                ::size((vector<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
                        *)&numLocals);
        LEB<unsigned_int,_unsigned_char>::LEB
                  ((LEB<unsigned_int,_unsigned_char> *)&__range4,(uint)sVar8);
        BufferWithRandomAccess::operator<<(pBVar2,__range4._0_4_);
        __end4 = std::
                 vector<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
                 ::begin((vector<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
                          *)&numLocals);
        local_228._M_current =
             (pair<unsigned_int,_wasm::Name> *)
             std::
             vector<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
             ::end((vector<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
                    *)&numLocals);
        while( true ) {
          bVar5 = __gnu_cxx::operator!=(&__end4,&local_228);
          if (!bVar5) break;
          indexInBinary_1 =
               &__gnu_cxx::
                __normal_iterator<std::pair<unsigned_int,_wasm::Name>_*,_std::vector<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>_>
                ::operator*(&__end4)->first;
          name = (type *)std::get<0ul,unsigned_int,wasm::Name>
                                   ((pair<unsigned_int,_wasm::Name> *)indexInBinary_1);
          local_240 = (undefined1  [8])
                      std::get<1ul,unsigned_int,wasm::Name>
                                ((pair<unsigned_int,_wasm::Name> *)indexInBinary_1);
          pBVar2 = this->o;
          LEB<unsigned_int,_unsigned_char>::LEB(&local_244,(uint)(name->super_IString).str._M_len);
          BufferWithRandomAccess::operator<<(pBVar2,local_244);
          namedTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = *(pointer *)local_240;
          writeEscapedName(this,*(string_view *)local_240);
          __gnu_cxx::
          __normal_iterator<std::pair<unsigned_int,_wasm::Name>_*,_std::vector<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>_>
          ::operator++(&__end4);
        }
        __range3_1._4_4_ = __range3_1._4_4_ + 1;
        std::
        vector<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
        ::~vector((vector<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
                   *)&numLocals);
        __gnu_cxx::
        __normal_iterator<std::pair<unsigned_int,_wasm::Function_*>_*,_std::vector<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>_>
        ::operator++(&__end3_1);
      }
      sVar8 = std::
              vector<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
              ::size((vector<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                      *)local_110);
      if (__range3_1._4_4_ != sVar8) {
        __assert_fail("emitted == functionsWithLocalNames.size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-binary.cpp"
                      ,0x3cc,"void wasm::WasmBinaryWriter::writeNames()");
      }
      finishSubsection(this,emitted);
    }
    std::
    vector<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
    ::~vector((vector<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
               *)local_110);
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&__range2);
    __end2 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::begin
                       (&(this->indexedTypes).types);
    type.id = (uintptr_t)
              std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::end
                        (&(this->indexedTypes).types);
    while( true ) {
      bVar5 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
                                  *)&type);
      if (!bVar5) break;
      pHVar13 = __gnu_cxx::
                __normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
                ::operator*(&__end2);
      _Stack_290._M_nxt = (_Hash_node_base *)pHVar13->id;
      sVar16 = std::
               unordered_map<wasm::HeapType,_wasm::TypeNames,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>_>
               ::count(&this->wasm->typeNames,(key_type *)&stack0xfffffffffffffd70);
      if (sVar16 != 0) {
        pmVar19 = std::
                  unordered_map<wasm::HeapType,_wasm::TypeNames,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>_>
                  ::operator[](&this->wasm->typeNames,(key_type *)&stack0xfffffffffffffd70);
        bVar5 = IString::is((IString *)pmVar19);
        if (bVar5) {
          std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::push_back
                    ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&__range2,
                     (value_type *)&stack0xfffffffffffffd70);
        }
      }
      __gnu_cxx::
      __normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
      ::operator++(&__end2);
    }
    bVar5 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::empty
                      ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&__range2);
    if (!bVar5) {
      __range3_2._4_4_ = startSubsection(this,NameType);
      pBVar2 = this->o;
      sVar8 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::size
                        ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&__range2);
      LEB<unsigned_int,_unsigned_char>::LEB
                ((LEB<unsigned_int,_unsigned_char> *)&__range3_2,(uint)sVar8);
      BufferWithRandomAccess::operator<<(pBVar2,__range3_2._0_4_);
      __end3_2 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::begin
                           ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&__range2);
      type_1.id = (uintptr_t)
                  std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::end
                            ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&__range2);
      while( true ) {
        bVar5 = __gnu_cxx::operator!=
                          (&__end3_2,
                           (__normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
                            *)&type_1);
        if (!bVar5) break;
        pHVar13 = __gnu_cxx::
                  __normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
                  ::operator*(&__end3_2);
        local_2b8.id = pHVar13->id;
        pBVar2 = this->o;
        pmVar18 = std::
                  unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
                  ::operator[](&(this->indexedTypes).indices,&local_2b8);
        LEB<unsigned_int,_unsigned_char>::LEB(&local_2bc,*pmVar18);
        BufferWithRandomAccess::operator<<(pBVar2,local_2bc);
        pmVar19 = std::
                  unordered_map<wasm::HeapType,_wasm::TypeNames,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>_>
                  ::operator[](&this->wasm->typeNames,&local_2b8);
        tablesWithNames.
        super__Vector_base<std::pair<unsigned_int,_wasm::Table_*>,_std::allocator<std::pair<unsigned_int,_wasm::Table_*>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)(pmVar19->name).super_IString.str._M_len;
        writeEscapedName(this,(pmVar19->name).super_IString.str);
        __gnu_cxx::
        __normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
        ::operator++(&__end3_2);
      }
      finishSubsection(this,__range3_2._4_4_);
    }
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&__range2);
    std::
    vector<std::pair<unsigned_int,_wasm::Table_*>,_std::allocator<std::pair<unsigned_int,_wasm::Table_*>_>_>
    ::vector((vector<std::pair<unsigned_int,_wasm::Table_*>,_std::allocator<std::pair<unsigned_int,_wasm::Table_*>_>_>
              *)local_2f0);
    check_2.checked._4_4_ = 0;
    pvVar23 = (vector<std::pair<unsigned_int,_wasm::Table_*>,_std::allocator<std::pair<unsigned_int,_wasm::Table_*>_>_>
               *)((long)&check_2.checked + 4);
    visitor_03.checked = (Index *)pvVar23;
    visitor_03.tablesWithNames = pvVar23;
    local_318 = (Module *)local_2f0;
    pvStack_310 = pvVar23;
    pMStack_308 = (Module *)local_2f0;
    check_2.tablesWithNames = pvVar23;
    wasm::ModuleUtils::iterImportedTables<wasm::WasmBinaryWriter::writeNames()::__2>
              ((ModuleUtils *)this->wasm,(Module *)local_2f0,visitor_03);
    pMStack_328 = pMStack_308;
    pbStack_320 = (pointer)check_2.tablesWithNames;
    visitor_04.checked = (Index *)pvVar23;
    visitor_04.tablesWithNames = check_2.tablesWithNames;
    wasm::ModuleUtils::iterDefinedTables<wasm::WasmBinaryWriter::writeNames()::__2>
              ((ModuleUtils *)this->wasm,pMStack_308,visitor_04);
    uVar6 = (ulong)check_2.checked._4_4_;
    sVar7 = std::
            unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
            ::size(&(this->indexes).tableIndexes);
    if (uVar6 != sVar7) {
      __assert_fail("checked == indexes.tableIndexes.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-binary.cpp"
                    ,0x3f1,"void wasm::WasmBinaryWriter::writeNames()");
    }
    sVar8 = std::
            vector<std::pair<unsigned_int,_wasm::Table_*>,_std::allocator<std::pair<unsigned_int,_wasm::Table_*>_>_>
            ::size((vector<std::pair<unsigned_int,_wasm::Table_*>,_std::allocator<std::pair<unsigned_int,_wasm::Table_*>_>_>
                    *)local_2f0);
    if (sVar8 != 0) {
      __range3_3._4_4_ = startSubsection(this,NameTable);
      pBVar2 = this->o;
      sVar8 = std::
              vector<std::pair<unsigned_int,_wasm::Table_*>,_std::allocator<std::pair<unsigned_int,_wasm::Table_*>_>_>
              ::size((vector<std::pair<unsigned_int,_wasm::Table_*>,_std::allocator<std::pair<unsigned_int,_wasm::Table_*>_>_>
                      *)local_2f0);
      LEB<unsigned_int,_unsigned_char>::LEB
                ((LEB<unsigned_int,_unsigned_char> *)&__range3_3,(uint)sVar8);
      BufferWithRandomAccess::operator<<(pBVar2,__range3_3._0_4_);
      __end3_3 = std::
                 vector<std::pair<unsigned_int,_wasm::Table_*>,_std::allocator<std::pair<unsigned_int,_wasm::Table_*>_>_>
                 ::begin((vector<std::pair<unsigned_int,_wasm::Table_*>,_std::allocator<std::pair<unsigned_int,_wasm::Table_*>_>_>
                          *)local_2f0);
      local_348._M_current =
           (pair<unsigned_int,_wasm::Table_*> *)
           std::
           vector<std::pair<unsigned_int,_wasm::Table_*>,_std::allocator<std::pair<unsigned_int,_wasm::Table_*>_>_>
           ::end((vector<std::pair<unsigned_int,_wasm::Table_*>,_std::allocator<std::pair<unsigned_int,_wasm::Table_*>_>_>
                  *)local_2f0);
      while( true ) {
        bVar5 = __gnu_cxx::operator!=(&__end3_3,&local_348);
        if (!bVar5) break;
        index_2 = &__gnu_cxx::
                   __normal_iterator<std::pair<unsigned_int,_wasm::Table_*>_*,_std::vector<std::pair<unsigned_int,_wasm::Table_*>,_std::allocator<std::pair<unsigned_int,_wasm::Table_*>_>_>_>
                   ::operator*(&__end3_3)->first;
        table = (type *)std::get<0ul,unsigned_int,wasm::Table*>
                                  ((pair<unsigned_int,_wasm::Table_*> *)index_2);
        local_360 = (pointer)std::get<1ul,unsigned_int,wasm::Table*>
                                       ((pair<unsigned_int,_wasm::Table_*> *)index_2);
        pBVar2 = this->o;
        LEB<unsigned_int,_unsigned_char>::LEB(&local_364,*(uint *)table);
        BufferWithRandomAccess::operator<<(pBVar2,local_364);
        memoriesWithNames.
        super__Vector_base<std::pair<unsigned_int,_wasm::Memory_*>,_std::allocator<std::pair<unsigned_int,_wasm::Memory_*>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             *(pointer *)
              *(__uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_> *)&local_360->name
        ;
        writeEscapedName(this,*(string_view *)
                               *(__uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_> *
                                )&local_360->name);
        __gnu_cxx::
        __normal_iterator<std::pair<unsigned_int,_wasm::Table_*>_*,_std::vector<std::pair<unsigned_int,_wasm::Table_*>,_std::allocator<std::pair<unsigned_int,_wasm::Table_*>_>_>_>
        ::operator++(&__end3_3);
      }
      finishSubsection(this,__range3_3._4_4_);
    }
    std::
    vector<std::pair<unsigned_int,_wasm::Table_*>,_std::allocator<std::pair<unsigned_int,_wasm::Table_*>_>_>
    ::~vector((vector<std::pair<unsigned_int,_wasm::Table_*>,_std::allocator<std::pair<unsigned_int,_wasm::Table_*>_>_>
               *)local_2f0);
    std::
    vector<std::pair<unsigned_int,_wasm::Memory_*>,_std::allocator<std::pair<unsigned_int,_wasm::Memory_*>_>_>
    ::vector((vector<std::pair<unsigned_int,_wasm::Memory_*>,_std::allocator<std::pair<unsigned_int,_wasm::Memory_*>_>_>
              *)local_390);
    check_3.checked._4_4_ = 0;
    pvVar24 = (vector<std::pair<unsigned_int,_wasm::Memory_*>,_std::allocator<std::pair<unsigned_int,_wasm::Memory_*>_>_>
               *)((long)&check_3.checked + 4);
    visitor_05.checked = (Index *)pvVar24;
    visitor_05.memoriesWithNames = pvVar24;
    local_3b8 = (Module *)local_390;
    pvStack_3b0 = pvVar24;
    pMStack_3a8 = (Module *)local_390;
    check_3.memoriesWithNames = pvVar24;
    wasm::ModuleUtils::iterImportedMemories<wasm::WasmBinaryWriter::writeNames()::__3>
              ((ModuleUtils *)this->wasm,(Module *)local_390,visitor_05);
    pMStack_3c8 = pMStack_3a8;
    pvStack_3c0 = check_3.memoriesWithNames;
    visitor_06.checked = (Index *)pvVar24;
    visitor_06.memoriesWithNames = check_3.memoriesWithNames;
    wasm::ModuleUtils::iterDefinedMemories<wasm::WasmBinaryWriter::writeNames()::__3>
              ((ModuleUtils *)this->wasm,pMStack_3a8,visitor_06);
    uVar6 = (ulong)check_3.checked._4_4_;
    sVar7 = std::
            unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
            ::size(&(this->indexes).memoryIndexes);
    if (uVar6 != sVar7) {
      __assert_fail("checked == indexes.memoryIndexes.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-binary.cpp"
                    ,0x40d,"void wasm::WasmBinaryWriter::writeNames()");
    }
    sVar8 = std::
            vector<std::pair<unsigned_int,_wasm::Memory_*>,_std::allocator<std::pair<unsigned_int,_wasm::Memory_*>_>_>
            ::size((vector<std::pair<unsigned_int,_wasm::Memory_*>,_std::allocator<std::pair<unsigned_int,_wasm::Memory_*>_>_>
                    *)local_390);
    if (sVar8 != 0) {
      __range3_4._4_4_ = startSubsection(this,NameMemory);
      pBVar2 = this->o;
      sVar8 = std::
              vector<std::pair<unsigned_int,_wasm::Memory_*>,_std::allocator<std::pair<unsigned_int,_wasm::Memory_*>_>_>
              ::size((vector<std::pair<unsigned_int,_wasm::Memory_*>,_std::allocator<std::pair<unsigned_int,_wasm::Memory_*>_>_>
                      *)local_390);
      LEB<unsigned_int,_unsigned_char>::LEB
                ((LEB<unsigned_int,_unsigned_char> *)&__range3_4,(uint)sVar8);
      BufferWithRandomAccess::operator<<(pBVar2,__range3_4._0_4_);
      __end3_4 = std::
                 vector<std::pair<unsigned_int,_wasm::Memory_*>,_std::allocator<std::pair<unsigned_int,_wasm::Memory_*>_>_>
                 ::begin((vector<std::pair<unsigned_int,_wasm::Memory_*>,_std::allocator<std::pair<unsigned_int,_wasm::Memory_*>_>_>
                          *)local_390);
      local_3e8._M_current =
           (pair<unsigned_int,_wasm::Memory_*> *)
           std::
           vector<std::pair<unsigned_int,_wasm::Memory_*>,_std::allocator<std::pair<unsigned_int,_wasm::Memory_*>_>_>
           ::end((vector<std::pair<unsigned_int,_wasm::Memory_*>,_std::allocator<std::pair<unsigned_int,_wasm::Memory_*>_>_>
                  *)local_390);
      while( true ) {
        bVar5 = __gnu_cxx::operator!=(&__end3_4,&local_3e8);
        if (!bVar5) break;
        index_3 = &__gnu_cxx::
                   __normal_iterator<std::pair<unsigned_int,_wasm::Memory_*>_*,_std::vector<std::pair<unsigned_int,_wasm::Memory_*>,_std::allocator<std::pair<unsigned_int,_wasm::Memory_*>_>_>_>
                   ::operator*(&__end3_4)->first;
        memory = (type *)std::get<0ul,unsigned_int,wasm::Memory*>
                                   ((pair<unsigned_int,_wasm::Memory_*> *)index_3);
        local_400 = (pointer)std::get<1ul,unsigned_int,wasm::Memory*>
                                       ((pair<unsigned_int,_wasm::Memory_*> *)index_3);
        pBVar2 = this->o;
        LEB<unsigned_int,_unsigned_char>::LEB(&local_404,*(uint *)memory);
        BufferWithRandomAccess::operator<<(pBVar2,local_404);
        pMVar4 = (type)(local_400->_M_t).
                       super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
                       super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                       super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
        globalsWithNames.
        super__Vector_base<std::pair<unsigned_int,_wasm::Global_*>,_std::allocator<std::pair<unsigned_int,_wasm::Global_*>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             *(pointer *)&(pMVar4->super_Importable).super_Named;
        writeEscapedName(this,*(string_view *)&(pMVar4->super_Importable).super_Named);
        __gnu_cxx::
        __normal_iterator<std::pair<unsigned_int,_wasm::Memory_*>_*,_std::vector<std::pair<unsigned_int,_wasm::Memory_*>,_std::allocator<std::pair<unsigned_int,_wasm::Memory_*>_>_>_>
        ::operator++(&__end3_4);
      }
      finishSubsection(this,__range3_4._4_4_);
    }
    std::
    vector<std::pair<unsigned_int,_wasm::Memory_*>,_std::allocator<std::pair<unsigned_int,_wasm::Memory_*>_>_>
    ::~vector((vector<std::pair<unsigned_int,_wasm::Memory_*>,_std::allocator<std::pair<unsigned_int,_wasm::Memory_*>_>_>
               *)local_390);
    std::
    vector<std::pair<unsigned_int,_wasm::Global_*>,_std::allocator<std::pair<unsigned_int,_wasm::Global_*>_>_>
    ::vector((vector<std::pair<unsigned_int,_wasm::Global_*>,_std::allocator<std::pair<unsigned_int,_wasm::Global_*>_>_>
              *)local_430);
    check_4.checked._4_4_ = 0;
    pvVar25 = (vector<std::pair<unsigned_int,_wasm::Global_*>,_std::allocator<std::pair<unsigned_int,_wasm::Global_*>_>_>
               *)((long)&check_4.checked + 4);
    visitor_07.checked = (Index *)pvVar25;
    visitor_07.globalsWithNames = pvVar25;
    local_458 = (Module *)local_430;
    pvStack_450 = pvVar25;
    pMStack_448 = (Module *)local_430;
    check_4.globalsWithNames = pvVar25;
    wasm::ModuleUtils::iterImportedGlobals<wasm::WasmBinaryWriter::writeNames()::__4>
              ((ModuleUtils *)this->wasm,(Module *)local_430,visitor_07);
    pMStack_468 = pMStack_448;
    pvStack_460 = check_4.globalsWithNames;
    visitor_08.checked = (Index *)pvVar25;
    visitor_08.globalsWithNames = check_4.globalsWithNames;
    wasm::ModuleUtils::iterDefinedGlobals<wasm::WasmBinaryWriter::writeNames()::__4>
              ((ModuleUtils *)this->wasm,pMStack_448,visitor_08);
    uVar6 = (ulong)check_4.checked._4_4_;
    sVar7 = std::
            unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
            ::size(&(this->indexes).globalIndexes);
    if (uVar6 != sVar7) {
      __assert_fail("checked == indexes.globalIndexes.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-binary.cpp"
                    ,0x426,"void wasm::WasmBinaryWriter::writeNames()");
    }
    sVar8 = std::
            vector<std::pair<unsigned_int,_wasm::Global_*>,_std::allocator<std::pair<unsigned_int,_wasm::Global_*>_>_>
            ::size((vector<std::pair<unsigned_int,_wasm::Global_*>,_std::allocator<std::pair<unsigned_int,_wasm::Global_*>_>_>
                    *)local_430);
    if (sVar8 != 0) {
      __range3_5._4_4_ = startSubsection(this,NameGlobal);
      pBVar2 = this->o;
      sVar8 = std::
              vector<std::pair<unsigned_int,_wasm::Global_*>,_std::allocator<std::pair<unsigned_int,_wasm::Global_*>_>_>
              ::size((vector<std::pair<unsigned_int,_wasm::Global_*>,_std::allocator<std::pair<unsigned_int,_wasm::Global_*>_>_>
                      *)local_430);
      LEB<unsigned_int,_unsigned_char>::LEB
                ((LEB<unsigned_int,_unsigned_char> *)&__range3_5,(uint)sVar8);
      BufferWithRandomAccess::operator<<(pBVar2,__range3_5._0_4_);
      __end3_5 = std::
                 vector<std::pair<unsigned_int,_wasm::Global_*>,_std::allocator<std::pair<unsigned_int,_wasm::Global_*>_>_>
                 ::begin((vector<std::pair<unsigned_int,_wasm::Global_*>,_std::allocator<std::pair<unsigned_int,_wasm::Global_*>_>_>
                          *)local_430);
      local_488._M_current =
           (pair<unsigned_int,_wasm::Global_*> *)
           std::
           vector<std::pair<unsigned_int,_wasm::Global_*>,_std::allocator<std::pair<unsigned_int,_wasm::Global_*>_>_>
           ::end((vector<std::pair<unsigned_int,_wasm::Global_*>,_std::allocator<std::pair<unsigned_int,_wasm::Global_*>_>_>
                  *)local_430);
      while( true ) {
        bVar5 = __gnu_cxx::operator!=(&__end3_5,&local_488);
        if (!bVar5) break;
        index_4 = &__gnu_cxx::
                   __normal_iterator<std::pair<unsigned_int,_wasm::Global_*>_*,_std::vector<std::pair<unsigned_int,_wasm::Global_*>,_std::allocator<std::pair<unsigned_int,_wasm::Global_*>_>_>_>
                   ::operator*(&__end3_5)->first;
        global_1 = (type *)std::get<0ul,unsigned_int,wasm::Global*>
                                     ((pair<unsigned_int,_wasm::Global_*> *)index_4);
        local_4a0 = std::get<1ul,unsigned_int,wasm::Global*>
                              ((pair<unsigned_int,_wasm::Global_*> *)index_4);
        pBVar2 = this->o;
        LEB<unsigned_int,_unsigned_char>::LEB(&local_4a4,*(uint *)global_1);
        BufferWithRandomAccess::operator<<(pBVar2,local_4a4);
        elemsWithNames.
        super__Vector_base<std::pair<unsigned_int,_wasm::ElementSegment_*>,_std::allocator<std::pair<unsigned_int,_wasm::ElementSegment_*>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)((*local_4a0)->super_Importable).super_Named.name.super_IString.str._M_len;
        writeEscapedName(this,((*local_4a0)->super_Importable).super_Named.name.super_IString.str);
        __gnu_cxx::
        __normal_iterator<std::pair<unsigned_int,_wasm::Global_*>_*,_std::vector<std::pair<unsigned_int,_wasm::Global_*>,_std::allocator<std::pair<unsigned_int,_wasm::Global_*>_>_>_>
        ::operator++(&__end3_5);
      }
      finishSubsection(this,__range3_5._4_4_);
    }
    std::
    vector<std::pair<unsigned_int,_wasm::Global_*>,_std::allocator<std::pair<unsigned_int,_wasm::Global_*>_>_>
    ::~vector((vector<std::pair<unsigned_int,_wasm::Global_*>,_std::allocator<std::pair<unsigned_int,_wasm::Global_*>_>_>
               *)local_430);
    std::
    vector<std::pair<unsigned_int,_wasm::ElementSegment_*>,_std::allocator<std::pair<unsigned_int,_wasm::ElementSegment_*>_>_>
    ::vector((vector<std::pair<unsigned_int,_wasm::ElementSegment_*>,_std::allocator<std::pair<unsigned_int,_wasm::ElementSegment_*>_>_>
              *)local_4d0);
    __range2_1._4_4_ = 0;
    this_01 = &this->wasm->elementSegments;
    __end2_1 = std::
               vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
               ::begin(this_01);
    curr = (unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *)
           std::
           vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
           ::end(this_01);
    while( true ) {
      bVar5 = __gnu_cxx::operator!=
                        (&__end2_1,
                         (__normal_iterator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_*,_std::vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>_>
                          *)&curr);
      if (!bVar5) break;
      local_4f8 = __gnu_cxx::
                  __normal_iterator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_*,_std::vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>_>
                  ::operator*(&__end2_1);
      pEVar14 = std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>::
                operator->(local_4f8);
      if (((pEVar14->super_Named).hasExplicitName & 1U) != 0) {
        pEStack_510 = std::
                      unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>::
                      get(local_4f8);
        std::pair<unsigned_int,_wasm::ElementSegment_*>::
        pair<unsigned_int_&,_wasm::ElementSegment_*,_true>
                  (&local_508,(uint *)((long)&__range2_1 + 4),&stack0xfffffffffffffaf0);
        std::
        vector<std::pair<unsigned_int,_wasm::ElementSegment_*>,_std::allocator<std::pair<unsigned_int,_wasm::ElementSegment_*>_>_>
        ::push_back((vector<std::pair<unsigned_int,_wasm::ElementSegment_*>,_std::allocator<std::pair<unsigned_int,_wasm::ElementSegment_*>_>_>
                     *)local_4d0,&local_508);
      }
      __range2_1._4_4_ = __range2_1._4_4_ + 1;
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_*,_std::vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>_>
      ::operator++(&__end2_1);
    }
    uVar6 = (ulong)__range2_1._4_4_;
    sVar7 = std::
            unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
            ::size(&(this->indexes).elemIndexes);
    if (uVar6 != sVar7) {
      __assert_fail("checked == indexes.elemIndexes.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-binary.cpp"
                    ,0x43d,"void wasm::WasmBinaryWriter::writeNames()");
    }
    sVar8 = std::
            vector<std::pair<unsigned_int,_wasm::ElementSegment_*>,_std::allocator<std::pair<unsigned_int,_wasm::ElementSegment_*>_>_>
            ::size((vector<std::pair<unsigned_int,_wasm::ElementSegment_*>,_std::allocator<std::pair<unsigned_int,_wasm::ElementSegment_*>_>_>
                    *)local_4d0);
    if (sVar8 != 0) {
      __range3_6._4_4_ = startSubsection(this,NameElem);
      pBVar2 = this->o;
      sVar8 = std::
              vector<std::pair<unsigned_int,_wasm::ElementSegment_*>,_std::allocator<std::pair<unsigned_int,_wasm::ElementSegment_*>_>_>
              ::size((vector<std::pair<unsigned_int,_wasm::ElementSegment_*>,_std::allocator<std::pair<unsigned_int,_wasm::ElementSegment_*>_>_>
                      *)local_4d0);
      LEB<unsigned_int,_unsigned_char>::LEB
                ((LEB<unsigned_int,_unsigned_char> *)&__range3_6,(uint)sVar8);
      BufferWithRandomAccess::operator<<(pBVar2,__range3_6._0_4_);
      __end3_6 = std::
                 vector<std::pair<unsigned_int,_wasm::ElementSegment_*>,_std::allocator<std::pair<unsigned_int,_wasm::ElementSegment_*>_>_>
                 ::begin((vector<std::pair<unsigned_int,_wasm::ElementSegment_*>,_std::allocator<std::pair<unsigned_int,_wasm::ElementSegment_*>_>_>
                          *)local_4d0);
      local_530._M_current =
           (pair<unsigned_int,_wasm::ElementSegment_*> *)
           std::
           vector<std::pair<unsigned_int,_wasm::ElementSegment_*>,_std::allocator<std::pair<unsigned_int,_wasm::ElementSegment_*>_>_>
           ::end((vector<std::pair<unsigned_int,_wasm::ElementSegment_*>,_std::allocator<std::pair<unsigned_int,_wasm::ElementSegment_*>_>_>
                  *)local_4d0);
      while( true ) {
        bVar5 = __gnu_cxx::operator!=(&__end3_6,&local_530);
        if (!bVar5) break;
        index_5 = &__gnu_cxx::
                   __normal_iterator<std::pair<unsigned_int,_wasm::ElementSegment_*>_*,_std::vector<std::pair<unsigned_int,_wasm::ElementSegment_*>,_std::allocator<std::pair<unsigned_int,_wasm::ElementSegment_*>_>_>_>
                   ::operator*(&__end3_6)->first;
        elem = (type *)std::get<0ul,unsigned_int,wasm::ElementSegment*>
                                 ((pair<unsigned_int,_wasm::ElementSegment_*> *)index_5);
        local_548 = std::get<1ul,unsigned_int,wasm::ElementSegment*>
                              ((pair<unsigned_int,_wasm::ElementSegment_*> *)index_5);
        pBVar2 = this->o;
        LEB<unsigned_int,_unsigned_char>::LEB(&local_54c,*(uint *)elem);
        BufferWithRandomAccess::operator<<(pBVar2,local_54c);
        writeEscapedName(this,((*local_548)->super_Named).name.super_IString.str);
        __gnu_cxx::
        __normal_iterator<std::pair<unsigned_int,_wasm::ElementSegment_*>_*,_std::vector<std::pair<unsigned_int,_wasm::ElementSegment_*>,_std::allocator<std::pair<unsigned_int,_wasm::ElementSegment_*>_>_>_>
        ::operator++(&__end3_6);
      }
      finishSubsection(this,__range3_6._4_4_);
    }
    std::
    vector<std::pair<unsigned_int,_wasm::ElementSegment_*>,_std::allocator<std::pair<unsigned_int,_wasm::ElementSegment_*>_>_>
    ::~vector((vector<std::pair<unsigned_int,_wasm::ElementSegment_*>,_std::allocator<std::pair<unsigned_int,_wasm::ElementSegment_*>_>_>
               *)local_4d0);
    __range2_2._4_4_ = 0;
    this_02 = &this->wasm->dataSegments;
    __end2_2 = std::
               vector<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
               ::begin(this_02);
    seg = (unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_> *)
          std::
          vector<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
          ::end(this_02);
    while( true ) {
      bVar5 = __gnu_cxx::operator!=
                        (&__end2_2,
                         (__normal_iterator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_*,_std::vector<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>_>
                          *)&seg);
      if (!bVar5) break;
      puStack_590 = __gnu_cxx::
                    __normal_iterator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_*,_std::vector<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>_>
                    ::operator*(&__end2_2);
      pDVar15 = std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::
                operator->(puStack_590);
      if (((pDVar15->super_Named).hasExplicitName & 1U) != 0) {
        __range2_2._4_4_ = __range2_2._4_4_ + 1;
      }
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_*,_std::vector<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>_>
      ::operator++(&__end2_2);
    }
    if (__range2_2._4_4_ != 0) {
      i = startSubsection(this,NameData);
      pBVar2 = this->o;
      LEB<unsigned_int,_unsigned_char>::LEB(&local_598,__range2_2._4_4_);
      BufferWithRandomAccess::operator<<(pBVar2,local_598);
      seg_1._4_4_ = 0;
      while( true ) {
        uVar6 = (ulong)seg_1._4_4_;
        sVar8 = std::
                vector<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                ::size(&this->wasm->dataSegments);
        if (sVar8 <= uVar6) break;
        local_5a8 = std::
                    vector<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                    ::operator[](&this->wasm->dataSegments,(ulong)seg_1._4_4_);
        pDVar15 = std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::
                  operator->(local_5a8);
        if (((pDVar15->super_Named).hasExplicitName & 1U) != 0) {
          pBVar2 = this->o;
          LEB<unsigned_int,_unsigned_char>::LEB(&local_5ac,seg_1._4_4_);
          BufferWithRandomAccess::operator<<(pBVar2,local_5ac);
          pDVar15 = std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::
                    operator->(local_5a8);
          relevantTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)(pDVar15->super_Named).name.super_IString.str._M_len;
          writeEscapedName(this,(pDVar15->super_Named).name.super_IString.str);
        }
        seg_1._4_4_ = seg_1._4_4_ + 1;
      }
      finishSubsection(this,i);
    }
    bVar5 = FeatureSet::hasGC(&this->wasm->features);
    if (bVar5) {
      std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
                ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&__range2_3);
      __end2_3 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::begin
                           (&(this->indexedTypes).types);
      type_2 = (HeapType *)
               std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::end
                         (&(this->indexedTypes).types);
      while( true ) {
        bVar5 = __gnu_cxx::operator!=
                          (&__end2_3,
                           (__normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
                            *)&type_2);
        if (!bVar5) break;
        pHStack_5f8 = __gnu_cxx::
                      __normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
                      ::operator*(&__end2_3);
        bVar5 = HeapType::isStruct(pHStack_5f8);
        if (bVar5) {
          sVar16 = std::
                   unordered_map<wasm::HeapType,_wasm::TypeNames,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>_>
                   ::count(&this->wasm->typeNames,pHStack_5f8);
          if (sVar16 != 0) {
            pmVar19 = std::
                      unordered_map<wasm::HeapType,_wasm::TypeNames,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>_>
                      ::operator[](&this->wasm->typeNames,pHStack_5f8);
            bVar5 = std::
                    unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
                    ::empty(&pmVar19->fieldNames);
            if (!bVar5) {
              std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::push_back
                        ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&__range2_3,
                         pHStack_5f8);
            }
          }
        }
        __gnu_cxx::
        __normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
        ::operator++(&__end2_3);
      }
      bVar5 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::empty
                        ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&__range2_3);
      if (!bVar5) {
        i_1 = startSubsection(this,NameField);
        pBVar2 = this->o;
        sVar8 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::size
                          ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&__range2_3);
        LEB<unsigned_int,_unsigned_char>::LEB(&local_600,(uint)sVar8);
        BufferWithRandomAccess::operator<<(pBVar2,local_600);
        type_3.id._4_4_ = 0;
        while( true ) {
          uVar6 = (ulong)type_3.id._4_4_;
          sVar8 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::size
                            ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&__range2_3)
          ;
          if (sVar8 <= uVar6) break;
          pvVar17 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                               &__range2_3,(ulong)type_3.id._4_4_);
          local_610.id = pvVar17->id;
          pBVar2 = this->o;
          pmVar18 = std::
                    unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
                    ::operator[](&(this->indexedTypes).indices,&local_610);
          LEB<unsigned_int,_unsigned_char>::LEB
                    ((LEB<unsigned_int,_unsigned_char> *)((long)&fieldNames + 4),*pmVar18);
          BufferWithRandomAccess::operator<<(pBVar2,fieldNames._4_4_);
          pmVar19 = std::
                    unordered_map<wasm::HeapType,_wasm::TypeNames,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>_>
                    ::at(&this->wasm->typeNames,&local_610);
          local_620 = &pmVar19->fieldNames;
          pBVar2 = this->o;
          sVar20 = std::
                   unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
                   ::size(local_620);
          LEB<unsigned_int,_unsigned_char>::LEB
                    ((LEB<unsigned_int,_unsigned_char> *)((long)&__range4_1 + 4),(uint)sVar20);
          BufferWithRandomAccess::operator<<(pBVar2,__range4_1._4_4_);
          this_00 = local_620;
          __end4_1 = std::
                     unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
                     ::begin(local_620);
          local_640._M_cur =
               (__node_type *)
               std::
               unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
               ::end(this_00);
          while( true ) {
            bVar5 = std::__detail::operator!=
                              (&__end4_1.
                                super__Node_iterator_base<std::pair<const_unsigned_int,_wasm::Name>,_false>
                               ,&local_640);
            if (!bVar5) break;
            index_6 = &std::__detail::
                       _Node_iterator<std::pair<const_unsigned_int,_wasm::Name>,_false,_false>::
                       operator*(&__end4_1)->first;
            name_1 = (type *)std::get<0ul,unsigned_int_const,wasm::Name>
                                       ((pair<const_unsigned_int,_wasm::Name> *)index_6);
            local_658 = (string_view *)
                        std::get<1ul,unsigned_int_const,wasm::Name>
                                  ((pair<const_unsigned_int,_wasm::Name> *)index_6);
            pBVar2 = this->o;
            LEB<unsigned_int,_unsigned_char>::LEB
                      (&local_65c,(uint)(name_1->super_IString).str._M_len);
            BufferWithRandomAccess::operator<<(pBVar2,local_65c);
            writeEscapedName(this,*local_658);
            std::__detail::_Node_iterator<std::pair<const_unsigned_int,_wasm::Name>,_false,_false>::
            operator++(&__end4_1);
          }
          type_3.id._4_4_ = type_3.id._4_4_ + 1;
        }
        finishSubsection(this,i_1);
      }
      std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector
                ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&__range2_3);
    }
    bVar5 = std::
            vector<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
            ::empty(&this->wasm->tags);
    if (!bVar5) {
      __range2_4._4_4_ = 0;
      this_03 = &this->wasm->tags;
      __end2_4 = std::
                 vector<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                 ::begin(this_03);
      tag = (unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_> *)
            std::
            vector<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
            ::end(this_03);
      while( true ) {
        bVar5 = __gnu_cxx::operator!=
                          (&__end2_4,
                           (__normal_iterator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_*,_std::vector<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>_>
                            *)&tag);
        if (!bVar5) break;
        puStack_6a0 = __gnu_cxx::
                      __normal_iterator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_*,_std::vector<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>_>
                      ::operator*(&__end2_4);
        pTVar21 = std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>::operator->
                            (puStack_6a0);
        if (((pTVar21->super_Importable).super_Named.hasExplicitName & 1U) != 0) {
          __range2_4._4_4_ = __range2_4._4_4_ + 1;
        }
        __gnu_cxx::
        __normal_iterator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_*,_std::vector<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>_>
        ::operator++(&__end2_4);
      }
      if (__range2_4._4_4_ != 0) {
        i_2 = startSubsection(this,NameTag);
        pBVar2 = this->o;
        LEB<unsigned_int,_unsigned_char>::LEB(&local_6a8,__range2_4._4_4_);
        BufferWithRandomAccess::operator<<(pBVar2,local_6a8);
        tag_1._4_4_ = 0;
        while( true ) {
          uVar6 = (ulong)tag_1._4_4_;
          sVar8 = std::
                  vector<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                  ::size(&this->wasm->tags);
          if (sVar8 <= uVar6) break;
          local_6b8 = std::
                      vector<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                      ::operator[](&this->wasm->tags,(ulong)tag_1._4_4_);
          pTVar21 = std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>::operator->
                              (local_6b8);
          if (((pTVar21->super_Importable).super_Named.hasExplicitName & 1U) != 0) {
            pBVar2 = this->o;
            LEB<unsigned_int,_unsigned_char>::LEB(&local_6bc,tag_1._4_4_);
            BufferWithRandomAccess::operator<<(pBVar2,local_6bc);
            pTVar21 = std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>::operator->
                                (local_6b8);
            writeEscapedName(this,(pTVar21->super_Importable).super_Named.name.super_IString.str);
          }
          tag_1._4_4_ = tag_1._4_4_ + 1;
        }
        finishSubsection(this,i_2);
      }
    }
    finishSection(this,local_14);
  }
  return;
}

Assistant:

void WasmBinaryWriter::writeNames() {
  auto start = startSection(BinaryConsts::Section::Custom);
  writeInlineString(BinaryConsts::CustomSections::Name);

  // module name
  if (emitModuleName && wasm->name.is()) {
    auto substart =
      startSubsection(BinaryConsts::CustomSections::Subsection::NameModule);
    writeEscapedName(wasm->name.str);
    finishSubsection(substart);
  }

  if (!debugInfo) {
    // We were only writing the module name.
    finishSection(start);
    return;
  }

  // function names
  {
    std::vector<std::pair<Index, Function*>> functionsWithNames;
    Index checked = 0;
    auto check = [&](Function* curr) {
      if (curr->hasExplicitName) {
        functionsWithNames.push_back({checked, curr});
      }
      checked++;
    };
    ModuleUtils::iterImportedFunctions(*wasm, check);
    ModuleUtils::iterDefinedFunctions(*wasm, check);
    assert(checked == indexes.functionIndexes.size());
    if (functionsWithNames.size() > 0) {
      auto substart =
        startSubsection(BinaryConsts::CustomSections::Subsection::NameFunction);
      o << U32LEB(functionsWithNames.size());
      for (auto& [index, global] : functionsWithNames) {
        o << U32LEB(index);
        writeEscapedName(global->name.str);
      }
      finishSubsection(substart);
    }
  }

  // local names
  {
    // Find all functions with at least one local name and only emit the
    // subsection if there is at least one.
    std::vector<std::pair<Index, Function*>> functionsWithLocalNames;
    Index checked = 0;
    auto check = [&](Function* curr) {
      auto numLocals = curr->getNumLocals();
      for (Index i = 0; i < numLocals; ++i) {
        if (curr->hasLocalName(i)) {
          functionsWithLocalNames.push_back({checked, curr});
          break;
        }
      }
      checked++;
    };
    ModuleUtils::iterImportedFunctions(*wasm, check);
    ModuleUtils::iterDefinedFunctions(*wasm, check);
    assert(checked == indexes.functionIndexes.size());
    if (functionsWithLocalNames.size() > 0) {
      // Otherwise emit those functions but only include locals with a name.
      auto substart =
        startSubsection(BinaryConsts::CustomSections::Subsection::NameLocal);
      o << U32LEB(functionsWithLocalNames.size());
      Index emitted = 0;
      for (auto& [index, func] : functionsWithLocalNames) {
        // Pairs of (local index in IR, name).
        std::vector<std::pair<Index, Name>> localsWithNames;
        auto numLocals = func->getNumLocals();
        for (Index indexInFunc = 0; indexInFunc < numLocals; ++indexInFunc) {
          if (func->hasLocalName(indexInFunc)) {
            Index indexInBinary;
            auto iter = funcMappedLocals.find(func->name);
            if (iter != funcMappedLocals.end()) {
              // TODO: handle multivalue
              indexInBinary = iter->second[{indexInFunc, 0}];
            } else {
              // No data on funcMappedLocals. That is only possible if we are an
              // imported function, where there are no locals to map, and in
              // that case the index is unchanged anyhow: parameters always have
              // the same index, they are not mapped in any way.
              assert(func->imported());
              indexInBinary = indexInFunc;
            }
            localsWithNames.push_back(
              {indexInBinary, func->getLocalName(indexInFunc)});
          }
        }
        assert(localsWithNames.size());
        std::sort(localsWithNames.begin(), localsWithNames.end());
        o << U32LEB(index);
        o << U32LEB(localsWithNames.size());
        for (auto& [indexInBinary, name] : localsWithNames) {
          o << U32LEB(indexInBinary);
          writeEscapedName(name.str);
        }
        emitted++;
      }
      assert(emitted == functionsWithLocalNames.size());
      finishSubsection(substart);
    }
  }

  // type names
  {
    std::vector<HeapType> namedTypes;
    for (auto type : indexedTypes.types) {
      if (wasm->typeNames.count(type) && wasm->typeNames[type].name.is()) {
        namedTypes.push_back(type);
      }
    }
    if (!namedTypes.empty()) {
      auto substart =
        startSubsection(BinaryConsts::CustomSections::Subsection::NameType);
      o << U32LEB(namedTypes.size());
      for (auto type : namedTypes) {
        o << U32LEB(indexedTypes.indices[type]);
        writeEscapedName(wasm->typeNames[type].name.str);
      }
      finishSubsection(substart);
    }
  }

  // table names
  {
    std::vector<std::pair<Index, Table*>> tablesWithNames;
    Index checked = 0;
    auto check = [&](Table* curr) {
      if (curr->hasExplicitName) {
        tablesWithNames.push_back({checked, curr});
      }
      checked++;
    };
    ModuleUtils::iterImportedTables(*wasm, check);
    ModuleUtils::iterDefinedTables(*wasm, check);
    assert(checked == indexes.tableIndexes.size());

    if (tablesWithNames.size() > 0) {
      auto substart =
        startSubsection(BinaryConsts::CustomSections::Subsection::NameTable);
      o << U32LEB(tablesWithNames.size());

      for (auto& [index, table] : tablesWithNames) {
        o << U32LEB(index);
        writeEscapedName(table->name.str);
      }

      finishSubsection(substart);
    }
  }

  // memory names
  {
    std::vector<std::pair<Index, Memory*>> memoriesWithNames;
    Index checked = 0;
    auto check = [&](Memory* curr) {
      if (curr->hasExplicitName) {
        memoriesWithNames.push_back({checked, curr});
      }
      checked++;
    };
    ModuleUtils::iterImportedMemories(*wasm, check);
    ModuleUtils::iterDefinedMemories(*wasm, check);
    assert(checked == indexes.memoryIndexes.size());
    if (memoriesWithNames.size() > 0) {
      auto substart =
        startSubsection(BinaryConsts::CustomSections::Subsection::NameMemory);
      o << U32LEB(memoriesWithNames.size());
      for (auto& [index, memory] : memoriesWithNames) {
        o << U32LEB(index);
        writeEscapedName(memory->name.str);
      }
      finishSubsection(substart);
    }
  }

  // global names
  {
    std::vector<std::pair<Index, Global*>> globalsWithNames;
    Index checked = 0;
    auto check = [&](Global* curr) {
      if (curr->hasExplicitName) {
        globalsWithNames.push_back({checked, curr});
      }
      checked++;
    };
    ModuleUtils::iterImportedGlobals(*wasm, check);
    ModuleUtils::iterDefinedGlobals(*wasm, check);
    assert(checked == indexes.globalIndexes.size());
    if (globalsWithNames.size() > 0) {
      auto substart =
        startSubsection(BinaryConsts::CustomSections::Subsection::NameGlobal);
      o << U32LEB(globalsWithNames.size());
      for (auto& [index, global] : globalsWithNames) {
        o << U32LEB(index);
        writeEscapedName(global->name.str);
      }
      finishSubsection(substart);
    }
  }

  // elem segment names
  {
    std::vector<std::pair<Index, ElementSegment*>> elemsWithNames;
    Index checked = 0;
    for (auto& curr : wasm->elementSegments) {
      if (curr->hasExplicitName) {
        elemsWithNames.push_back({checked, curr.get()});
      }
      checked++;
    }
    assert(checked == indexes.elemIndexes.size());

    if (elemsWithNames.size() > 0) {
      auto substart =
        startSubsection(BinaryConsts::CustomSections::Subsection::NameElem);
      o << U32LEB(elemsWithNames.size());

      for (auto& [index, elem] : elemsWithNames) {
        o << U32LEB(index);
        writeEscapedName(elem->name.str);
      }

      finishSubsection(substart);
    }
  }

  // data segment names
  {
    Index count = 0;
    for (auto& seg : wasm->dataSegments) {
      if (seg->hasExplicitName) {
        count++;
      }
    }

    if (count) {
      auto substart =
        startSubsection(BinaryConsts::CustomSections::Subsection::NameData);
      o << U32LEB(count);
      for (Index i = 0; i < wasm->dataSegments.size(); i++) {
        auto& seg = wasm->dataSegments[i];
        if (seg->hasExplicitName) {
          o << U32LEB(i);
          writeEscapedName(seg->name.str);
        }
      }
      finishSubsection(substart);
    }
  }

  // TODO: label, type, and element names
  // see: https://github.com/WebAssembly/extended-name-section

  // GC field names
  if (wasm->features.hasGC()) {
    std::vector<HeapType> relevantTypes;
    for (auto& type : indexedTypes.types) {
      if (type.isStruct() && wasm->typeNames.count(type) &&
          !wasm->typeNames[type].fieldNames.empty()) {
        relevantTypes.push_back(type);
      }
    }
    if (!relevantTypes.empty()) {
      auto substart =
        startSubsection(BinaryConsts::CustomSections::Subsection::NameField);
      o << U32LEB(relevantTypes.size());
      for (Index i = 0; i < relevantTypes.size(); i++) {
        auto type = relevantTypes[i];
        o << U32LEB(indexedTypes.indices[type]);
        std::unordered_map<Index, Name>& fieldNames =
          wasm->typeNames.at(type).fieldNames;
        o << U32LEB(fieldNames.size());
        for (auto& [index, name] : fieldNames) {
          o << U32LEB(index);
          writeEscapedName(name.str);
        }
      }
      finishSubsection(substart);
    }
  }

  // tag names
  if (!wasm->tags.empty()) {
    Index count = 0;
    for (auto& tag : wasm->tags) {
      if (tag->hasExplicitName) {
        count++;
      }
    }

    if (count) {
      auto substart =
        startSubsection(BinaryConsts::CustomSections::Subsection::NameTag);
      o << U32LEB(count);
      for (Index i = 0; i < wasm->tags.size(); i++) {
        auto& tag = wasm->tags[i];
        if (tag->hasExplicitName) {
          o << U32LEB(i);
          writeEscapedName(tag->name.str);
        }
      }
      finishSubsection(substart);
    }
  }

  finishSection(start);
}